

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

void __thiscall stick::Error::Error(Error *this,Int32 _code,ErrorCategory *_category)

{
  Allocator *pAVar1;
  
  this->m_category = _category;
  this->m_code = _code;
  pAVar1 = defaultAllocator();
  (this->m_message).m_cStr = (char *)0x0;
  (this->m_message).m_length = 0;
  (this->m_message).m_capacity = 0;
  (this->m_message).m_allocator = pAVar1;
  pAVar1 = defaultAllocator();
  (this->m_file).m_cStr = (char *)0x0;
  (this->m_file).m_length = 0;
  (this->m_file).m_capacity = 0;
  (this->m_file).m_allocator = pAVar1;
  return;
}

Assistant:

Error::Error(Int32 _code, const ErrorCategory & _category) : m_category(&_category), m_code(_code)
{
}